

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O1

void save_load(lda *l,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  initial_weights *iw;
  ostream *poVar2;
  size_t sVar3;
  float *data;
  size_t sVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint32_t *puVar5;
  ulong uVar6;
  vw *all;
  byte bVar7;
  uint64_t i;
  uint32_t j;
  initial_weights init;
  ulong local_1f8;
  uint local_1f0;
  uint local_1ec;
  vw *local_1e8;
  uint local_1dc;
  lda *local_1d8;
  sparse_parameters *local_1d0;
  version_struct *local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  
  local_1f0 = (uint)CONCAT71(in_register_00000009,text);
  all = l->all;
  local_1c0 = (ulong)all->num_bits;
  local_1d8 = l;
  if ((int)CONCAT71(in_register_00000011,read) != 0) {
    initialize_regressor(all);
    local_1b8._0_4_ = all->initial_t;
    local_1b8._12_4_ = all->lda;
    local_1b8._4_4_ =
         ((local_1d8->lda_D / (float)(uint)local_1b8._12_4_) /
         (float)(ulong)(1L << ((byte)all->num_bits & 0x3f))) * 200.0;
    bVar1 = (all->weights).sparse;
    puVar5 = &(all->weights).dense_weights._stride_shift;
    if (bVar1 != false) {
      puVar5 = &(all->weights).sparse_weights._stride_shift;
    }
    local_1b8._16_4_ = 1 << ((byte)*puVar5 & 0x1f);
    local_1b8[8] = all->random_weights;
    if (bVar1 == true) {
      iw = calloc_or_throw<initial_weights>(1);
      iw->_stride = local_1b8._16_4_;
      iw->_initial = (weight)local_1b8._0_4_;
      iw->_initial_random = (weight)local_1b8._4_4_;
      iw->_random = (bool)(char)local_1b8._8_4_;
      *(int3 *)&iw->field_0x9 = SUB43(local_1b8._8_4_,1);
      iw->_lda = local_1b8._12_4_;
      (all->weights).sparse_weights.default_data = iw;
      (all->weights).sparse_weights.fun = set_initial_lda_wrapper<sparse_parameters>::func;
      set_initial_lda_wrapper<sparse_parameters>::func
                ((all->weights).sparse_weights.default_value,iw,0);
    }
    else {
      dense_parameters::set_default<initial_weights,set_initial_lda_wrapper<dense_parameters>>
                (&(all->weights).dense_weights,(initial_weights *)local_1b8);
    }
  }
  if ((model_file->files)._end != (model_file->files)._begin) {
    local_1f8 = 0;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    bVar7 = (byte)local_1f0 ^ 1;
    local_1c8 = &all->model_file_ver;
    local_1d0 = &(all->weights).sparse_weights;
    local_1ec = local_1f0 & 0xff;
    local_1e8 = all;
LAB_00196ba7:
    do {
      uVar6 = (ulong)all->lda;
      if (bVar7 == 0 && !read) {
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)(local_1b8 + 0x10));
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      }
      if (read) {
        bVar1 = version_struct::operator>=(local_1c8,"8.0.3");
        if (bVar1) {
          if (!read) goto LAB_00196c0d;
          sVar3 = io_buf::bin_read_fixed(model_file,(char *)&local_1f8,8,"");
        }
        else {
          sVar3 = io_buf::bin_read_fixed(model_file,(char *)&local_1dc,4,"");
          local_1f8 = (ulong)local_1dc;
        }
      }
      else {
LAB_00196c0d:
        sVar3 = bin_text_write_fixed
                          (model_file,(char *)&local_1f8,8,(stringstream *)local_1b8,
                           SUB41(local_1ec,0));
      }
      if (sVar3 == 0) {
        sVar3 = 0;
      }
      else {
        if ((local_1e8->weights).sparse == true) {
          data = sparse_parameters::operator[]
                           (local_1d0,
                            local_1f8 <<
                            ((byte)(local_1e8->weights).sparse_weights._stride_shift & 0x3f));
        }
        else {
          data = (local_1e8->weights).dense_weights._begin +
                 (local_1f8 << ((byte)(local_1e8->weights).dense_weights._stride_shift & 0x3f) &
                 (local_1e8->weights).dense_weights._weight_mask);
        }
        for (; uVar6 != 0; uVar6 = uVar6 - 1) {
          if (bVar7 == 0 && !read) {
            poVar2 = std::ostream::_M_insert<double>((double)(*data + local_1d8->lda_rho));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          }
          if (read) {
            sVar4 = io_buf::bin_read_fixed(model_file,(char *)data,4,"");
          }
          else {
            sVar4 = bin_text_write_fixed
                              (model_file,(char *)data,4,(stringstream *)local_1b8,
                               SUB41(local_1ec,0));
          }
          sVar3 = sVar3 + sVar4;
          data = data + 1;
        }
      }
      all = local_1e8;
      if ((char)local_1f0 != '\0') {
        if ((read) ||
           (std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_1b8 + 0x10),"\n",1)
           , read)) {
          sVar4 = 0;
        }
        else {
          sVar4 = bin_text_write_fixed(model_file,(char *)0x0,0,(stringstream *)local_1b8,true);
        }
        sVar3 = sVar3 + sVar4;
      }
      if (!read) {
        local_1f8 = local_1f8 + 1;
        if (local_1f8 >> ((byte)local_1c0 & 0x3f) != 0) break;
        goto LAB_00196ba7;
      }
    } while (sVar3 != 0);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void save_load(lda &l, io_buf &model_file, bool read, bool text)
{
  vw &all = *(l.all);
  uint64_t length = (uint64_t)1 << all.num_bits;
  if (read)
  {
    initialize_regressor(all);
    initial_weights init(all.initial_t, (float)(l.lda_D / all.lda / all.length() * 200), all.random_weights, all.lda,
        all.weights.stride());
    if (all.weights.sparse)
      all.weights.sparse_weights.set_default<initial_weights, set_initial_lda_wrapper<sparse_parameters>>(init);
    else
      all.weights.dense_weights.set_default<initial_weights, set_initial_lda_wrapper<dense_parameters>>(init);
  }
  if (model_file.files.size() > 0)
  {
    uint64_t i = 0;
    stringstream msg;
    size_t brw = 1;

    do
    {
      brw = 0;
      size_t K = all.lda;
      if (!read && text)
        msg << i << " ";

      if (!read || all.model_file_ver >= VERSION_FILE_WITH_HEADER_ID)
        brw += bin_text_read_write_fixed(model_file, (char *)&i, sizeof(i), "", read, msg, text);
      else
      {
        // support 32bit build models
        uint32_t j;
        brw += bin_text_read_write_fixed(model_file, (char *)&j, sizeof(j), "", read, msg, text);
        i = j;
      }

      if (brw != 0)
      {
        weight *w = &(all.weights.strided_index(i));
        for (uint64_t k = 0; k < K; k++)
        {
          weight *v = w + k;
          if (!read && text)
            msg << *v + l.lda_rho << " ";
          brw += bin_text_read_write_fixed(model_file, (char *)v, sizeof(*v), "", read, msg, text);
        }
      }
      if (text)
      {
        if (!read)
          msg << "\n";
        brw += bin_text_read_write_fixed(model_file, nullptr, 0, "", read, msg, text);
      }
      if (!read)
        ++i;
    } while ((!read && i < length) || (read && brw > 0));
  }
}